

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O3

void __thiscall
QTextDocument::setMetaInformation(QTextDocument *this,MetaInformation info,QString *string)

{
  if (info < 4) {
    QString::operator=((QString *)(*(long *)&this->field_0x8 + (ulong)(info * 0x18) + 0x2a8),
                       (QString *)string);
    return;
  }
  return;
}

Assistant:

void QTextDocument::setMetaInformation(MetaInformation info, const QString &string)
{
    Q_D(QTextDocument);
    switch (info) {
    case DocumentTitle:
        d->title = string;
        break;
    case DocumentUrl:
        d->url = string;
        break;
    case CssMedia:
        d->cssMedia = string;
        break;
    case FrontMatter:
        d->frontMatter = string;
        break;
    }
}